

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O3

bool __thiscall
BamTools::Internal::BamToolsIndex::HasAlignments(BamToolsIndex *this,int *referenceID)

{
  pointer pBVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = (ulong)*referenceID;
  if (-1 < (long)uVar3) {
    pBVar1 = (this->m_indexFileSummary).
             super__Vector_base<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar2 = (long)(this->m_indexFileSummary).
                  super__Vector_base<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1 >> 4;
    if (*referenceID < (int)uVar2) {
      if (uVar3 < uVar2) {
        return 0 < pBVar1[uVar3].NumBlocks;
      }
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
  }
  return false;
}

Assistant:

bool BamToolsIndex::HasAlignments(const int& referenceID) const
{
    if (referenceID < 0 || referenceID >= (int)m_indexFileSummary.size()) return false;
    const BtiReferenceSummary& refSummary = m_indexFileSummary.at(referenceID);
    return (refSummary.NumBlocks > 0);
}